

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makecrct.c
# Opt level: O2

void write_table(uint32_t *table,int k)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar3 = (ulong)(uint)k;
  if (k < 1) {
    uVar3 = 0;
  }
  uVar5 = 0;
  while( true ) {
    if (uVar3 == uVar5) break;
    iVar1 = (int)((uVar5 & 0xffffffff) / 5) * -5;
    pcVar4 = "";
    if ((uVar5 != 0) && (pcVar4 = "    ", (int)uVar5 + iVar1 != 0)) {
      pcVar4 = "";
    }
    pcVar2 = "";
    if ((k - 1 != uVar5) && (pcVar2 = ",\n", iVar1 + (int)uVar5 != 4)) {
      pcVar2 = ", ";
    }
    printf("%s0x%08x%s",pcVar4,(ulong)table[uVar5],pcVar2);
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

static void write_table(const uint32_t *table, int k) {
    int n;

    for (n = 0; n < k; n++)
        printf("%s0x%08" PRIx32 "%s", n == 0 || n % 5 ? "" : "    ",
                (uint32_t)(table[n]),
                n == k - 1 ? "" : (n % 5 == 4 ? ",\n" : ", "));
}